

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Gamemode(FParser *this)

{
  int iVar1;
  FParser *this_local;
  
  (this->t_return).type = 1;
  if ((multiplayer & 1U) == 0) {
    (this->t_return).value.i = 0;
  }
  else {
    iVar1 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar1 == 0) {
      (this->t_return).value.i = 1;
    }
    else {
      (this->t_return).value.i = 2;
    }
  }
  return;
}

Assistant:

void FParser::SF_Gamemode(void)
{
	t_return.type = svt_int;   
	if(!multiplayer)
	{
		t_return.value.i = 0; // single-player
	}
	else if(!deathmatch)
	{
		t_return.value.i = 1; // cooperative
	}
	else
		t_return.value.i = 2; // deathmatch
}